

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

bool __thiscall
kj::Directory::tryTransfer
          (Directory *this,PathPtr toPath,WriteMode toMode,Directory *fromDirectory,PathPtr fromPath
          ,TransferMode mode)

{
  PathPtr toPath_00;
  Directory *pDVar1;
  String *pSVar2;
  uint uVar3;
  size_t sVar4;
  NullableValue<bool> *other;
  bool *pbVar5;
  bool *pbVar6;
  NullableValue<kj::FsNode::Metadata> *other_00;
  Metadata *pMVar7;
  Fault local_160;
  Fault f_1;
  Maybe<kj::FsNode::Metadata> local_f0;
  undefined1 local_b8 [8];
  NullableValue<kj::FsNode::Metadata> meta;
  undefined4 local_78;
  undefined4 uStack_70;
  Maybe<bool> local_58;
  NullableValue<bool> local_56 [4];
  NullableValue<bool> result;
  Fault local_48;
  Fault f;
  TransferMode mode_local;
  Directory *fromDirectory_local;
  WriteMode toMode_local;
  Directory *this_local;
  PathPtr toPath_local;
  
  toPath_local.parts.ptr = (String *)toPath.parts.size_;
  this_local = (Directory *)toPath.parts.ptr;
  f.exception._4_4_ = mode;
  sVar4 = PathPtr::size((PathPtr *)&this_local);
  if (sVar4 == 0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x2cc,FAILED,"toPath.size() > 0","\"can\'t replace self\"",
               (char (*) [19])"can\'t replace self");
    toPath_local.parts.size_._7_1_ = 0;
    _::Debug::Fault::~Fault(&local_48);
  }
  else {
    local_78 = fromPath.parts.ptr._0_4_;
    uStack_70 = (undefined4)fromPath.parts.size_;
    (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x15])
              (&local_58,fromDirectory,this,this_local,toPath_local.parts.ptr,(ulong)toMode,local_78
               ,uStack_70,f.exception._4_4_);
    other = _::readMaybe<bool>(&local_58);
    _::NullableValue<bool>::NullableValue(local_56,other);
    Maybe<bool>::~Maybe(&local_58);
    pbVar5 = _::NullableValue::operator_cast_to_bool_((NullableValue *)local_56);
    if (pbVar5 != (bool *)0x0) {
      pbVar6 = _::NullableValue<bool>::operator*(local_56);
      toPath_local.parts.size_._7_1_ = *pbVar6 & 1;
    }
    meta.field_1.value.hashCode._5_3_ = 0;
    meta.field_1.value.hashCode._4_1_ = pbVar5 != (bool *)0x0;
    _::NullableValue<bool>::~NullableValue(local_56);
    if (meta.field_1.value.hashCode._4_4_ == 0) {
      if (f.exception._4_4_ == MOVE) {
        uVar3 = (*(this->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x14])
                          (this,this_local,toPath_local.parts.ptr,(ulong)toMode,fromDirectory,2,
                           local_78,uStack_70);
        if ((uVar3 & 1) == 0) {
          toPath_local.parts.size_._7_1_ = 0;
        }
        else {
          f_1.exception = (Exception *)fromPath.parts.ptr;
          remove(fromDirectory,(char *)fromPath.parts.ptr);
          toPath_local.parts.size_._7_1_ = 1;
        }
      }
      else if (f.exception._4_4_ == LINK) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[54]>
                  (&local_160,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x2e4,FAILED,(char *)0x0,
                   "\"can\'t link across different Directory implementations\"",
                   (char (*) [54])"can\'t link across different Directory implementations");
        toPath_local.parts.size_._7_1_ = 0;
        meta.field_1.value.hashCode._4_4_ = 1;
        _::Debug::Fault::~Fault(&local_160);
      }
      else {
        if (f.exception._4_4_ != COPY) {
          _::unreachable();
        }
        (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[9])
                  (&local_f0,fromDirectory,fromPath.parts.ptr,fromPath.parts.size_);
        other_00 = _::readMaybe<kj::FsNode::Metadata>(&local_f0);
        _::NullableValue<kj::FsNode::Metadata>::NullableValue
                  ((NullableValue<kj::FsNode::Metadata> *)local_b8,other_00);
        Maybe<kj::FsNode::Metadata>::~Maybe(&local_f0);
        pMVar7 = _::NullableValue::operator_cast_to_Metadata_((NullableValue *)local_b8);
        pSVar2 = toPath_local.parts.ptr;
        pDVar1 = this_local;
        if (pMVar7 == (Metadata *)0x0) {
          toPath_local.parts.size_._7_1_ = false;
        }
        else {
          pMVar7 = _::NullableValue<kj::FsNode::Metadata>::operator->
                             ((NullableValue<kj::FsNode::Metadata> *)local_b8);
          toPath_00.parts.size_ = (size_t)pSVar2;
          toPath_00.parts.ptr = (String *)pDVar1;
          toPath_local.parts.size_._7_1_ =
               tryCopyDirectoryEntry
                         (this,toPath_00,toMode,&fromDirectory->super_ReadableDirectory,fromPath,
                          pMVar7->type,true);
        }
        meta.field_1.value.hashCode._4_4_ = 1;
        _::NullableValue<kj::FsNode::Metadata>::~NullableValue
                  ((NullableValue<kj::FsNode::Metadata> *)local_b8);
      }
    }
  }
  return (bool)(toPath_local.parts.size_._7_1_ & 1);
}

Assistant:

bool Directory::tryTransfer(PathPtr toPath, WriteMode toMode,
                            const Directory& fromDirectory, PathPtr fromPath,
                            TransferMode mode) const {
  KJ_REQUIRE(toPath.size() > 0, "can't replace self") { return false; }

  // First try reversing.
  KJ_IF_MAYBE(result, fromDirectory.tryTransferTo(*this, toPath, toMode, fromPath, mode)) {
    return *result;
  }

  switch (mode) {
    case TransferMode::COPY:
      KJ_IF_MAYBE(meta, fromDirectory.tryLstat(fromPath)) {
        return tryCopyDirectoryEntry(*this, toPath, toMode, fromDirectory,
                                     fromPath, meta->type, true);
      } else {
        // Source doesn't exist.
        return false;
      }
    case TransferMode::MOVE:
      // Implement move as copy-then-delete.
      if (!tryTransfer(toPath, toMode, fromDirectory, fromPath, TransferMode::COPY)) {
        return false;
      }
      fromDirectory.remove(fromPath);
      return true;
    case TransferMode::LINK:
      KJ_FAIL_REQUIRE("can't link across different Directory implementations") { return false; }
  }

  KJ_UNREACHABLE;
}